

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateState.cpp
# Opt level: O1

void __thiscall
helics::FederateState::setProperty(FederateState *this,int intProperty,int propertyVal)

{
  int iVar1;
  long lVar2;
  int iVar3;
  size_t newSize;
  
  if (intProperty < 0x10f) {
    if (intProperty == 0x8f) {
      (this->rt_lag).internalTimeCode =
           (long)((double)propertyVal * 1000000000.0 +
                 *(double *)(&DAT_003d20a0 + (ulong)(0.0 <= (double)propertyVal * 1000000000.0) * 8)
                 );
    }
    else {
      if (intProperty == 0x90) {
        lVar2 = (long)((double)propertyVal * 1000000000.0 +
                      *(double *)
                       (&DAT_003d20a0 + (ulong)(0.0 <= (double)propertyVal * 1000000000.0) * 8));
      }
      else {
        if (intProperty != 0x91) goto switchD_002c5a3f_caseD_111;
        lVar2 = (long)((double)propertyVal * 1000000000.0 +
                      *(double *)
                       (&DAT_003d20a0 + (ulong)(0.0 <= (double)propertyVal * 1000000000.0) * 8));
        (this->rt_lag).internalTimeCode = lVar2;
      }
      (this->rt_lead).internalTimeCode = lVar2;
    }
  }
  else {
    switch(intProperty) {
    case 0x10f:
    case 0x110:
    case 0x112:
      LogManager::setLogLevel
                ((this->mLogManager)._M_t.
                 super___uniq_ptr_impl<helics::LogManager,_std::default_delete<helics::LogManager>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_helics::LogManager_*,_std::default_delete<helics::LogManager>_>
                 .super__Head_base<0UL,_helics::LogManager_*,_false>._M_head_impl,propertyVal);
      this->maxLogLevel =
           (((this->mLogManager)._M_t.
             super___uniq_ptr_impl<helics::LogManager,_std::default_delete<helics::LogManager>_>.
             _M_t.
             super__Tuple_impl<0UL,_helics::LogManager_*,_std::default_delete<helics::LogManager>_>.
             super__Head_base<0UL,_helics::LogManager_*,_false>._M_head_impl)->maxLogLevel).
           super___atomic_base<int>._M_i;
      break;
    default:
switchD_002c5a3f_caseD_111:
      TimeCoordinator::setProperty
                ((this->timeCoord)._M_t.
                 super___uniq_ptr_impl<helics::TimeCoordinator,_std::default_delete<helics::TimeCoordinator>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_helics::TimeCoordinator_*,_std::default_delete<helics::TimeCoordinator>_>
                 .super__Head_base<0UL,_helics::TimeCoordinator_*,_false>._M_head_impl,intProperty,
                 propertyVal);
      return;
    case 0x114:
      newSize = 0;
      if (0 < propertyVal) {
        newSize = (size_t)(uint)propertyVal;
      }
      LogBuffer::resize(&((this->mLogManager)._M_t.
                          super___uniq_ptr_impl<helics::LogManager,_std::default_delete<helics::LogManager>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_helics::LogManager_*,_std::default_delete<helics::LogManager>_>
                          .super__Head_base<0UL,_helics::LogManager_*,_false>._M_head_impl)->
                         mLogBuffer,newSize);
      return;
    case 0x11a:
      iVar1 = 0;
      if (0 < propertyVal) {
        iVar1 = propertyVal;
      }
      iVar3 = 0x10;
      if (iVar1 < 0x10) {
        iVar3 = iVar1;
      }
      this->indexGroup = iVar3;
    }
  }
  return;
}

Assistant:

void FederateState::setProperty(int intProperty, int propertyVal)
{
    switch (intProperty) {
        case defs::Properties::LOG_LEVEL:
        case defs::Properties::FILE_LOG_LEVEL:
        case defs::Properties::CONSOLE_LOG_LEVEL:
            mLogManager->setLogLevel(propertyVal);
            maxLogLevel = mLogManager->getMaxLevel();
            break;
        case defs::Properties::RT_LAG:
            rt_lag = helics::Time(static_cast<double>(propertyVal));
            break;
        case defs::Properties::INDEX_GROUP:
            indexGroup = (propertyVal > 16) ? 16 : ((propertyVal < 0) ? 0 : propertyVal);
            break;
        case defs::Properties::RT_LEAD:
            rt_lead = helics::Time(static_cast<double>(propertyVal));
            break;
        case defs::Properties::RT_TOLERANCE:
            rt_lag = helics::Time(static_cast<double>(propertyVal));
            rt_lead = rt_lag;
            break;
        case defs::Properties::LOG_BUFFER:
            mLogManager->getLogBuffer().resize(
                (propertyVal <= 0) ? 0UL : static_cast<std::size_t>(propertyVal));
            break;
        default:
            timeCoord->setProperty(intProperty, propertyVal);
    }
}